

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::
InternalGenerateTypeDependentAccessorDeclarations
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "$deprecated_attr$$type$* mutable_$name$(int index);\n$deprecated_attr$$type$* add_$name$();\n"
                    );
  if (this->dependent_getter_ == true) {
    io::Printer::Print(printer,variables,
                       "$deprecated_attr$const ::google::protobuf::RepeatedPtrField< $type$ >&\n    $name$() const;\n"
                      );
  }
  io::Printer::Print(printer,variables,
                     "$deprecated_attr$::google::protobuf::RepeatedPtrField< $type$ >*\n    mutable_$name$();\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
InternalGenerateTypeDependentAccessorDeclarations(io::Printer* printer) const {
  printer->Print(variables_,
    "$deprecated_attr$$type$* mutable_$name$(int index);\n"
    "$deprecated_attr$$type$* add_$name$();\n");
  if (dependent_getter_) {
    printer->Print(variables_,
      "$deprecated_attr$const ::google::protobuf::RepeatedPtrField< $type$ >&\n"
      "    $name$() const;\n");
  }
  printer->Print(variables_,
    "$deprecated_attr$::google::protobuf::RepeatedPtrField< $type$ >*\n"
    "    mutable_$name$();\n");
}